

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

char * __thiscall cmTarget::GetSuffixVariableInternal(cmTarget *this,ArtifactType artifact)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  string local_40;
  
  switch(this->TargetTypeValue) {
  case EXECUTABLE:
    if (artifact == ImportLibraryArtifact) {
      return "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    if (artifact == RuntimeBinaryArtifact) {
      bVar1 = this->IsAndroid;
      if (bVar1 == true) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ANDROID_GUI","");
        pcVar3 = GetProperty(this,&local_40);
        bVar2 = cmSystemTools::IsOn(pcVar3);
      }
      else {
        bVar2 = false;
      }
      pcVar3 = "CMAKE_EXECUTABLE_SUFFIX";
      if (bVar2 != false) {
        pcVar3 = "CMAKE_SHARED_LIBRARY_SUFFIX";
      }
      if (bVar1 != false) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          return pcVar3;
        }
        return pcVar3;
      }
      return pcVar3;
    }
  default:
    return "";
  case STATIC_LIBRARY:
    return "CMAKE_STATIC_LIBRARY_SUFFIX";
  case SHARED_LIBRARY:
    pcVar3 = "";
    if (artifact == ImportLibraryArtifact) {
      pcVar3 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    pcVar4 = "CMAKE_SHARED_LIBRARY_SUFFIX";
    break;
  case MODULE_LIBRARY:
    pcVar3 = "";
    if (artifact == ImportLibraryArtifact) {
      pcVar3 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    pcVar4 = "CMAKE_SHARED_MODULE_SUFFIX";
  }
  if (artifact != RuntimeBinaryArtifact) {
    pcVar4 = pcVar3;
  }
  return pcVar4;
}

Assistant:

const char* cmTargetPropertyComputer::GetSources<cmTarget>(
  cmTarget const* tgt, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  cmStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return nullptr;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (std::string const& entry : entries) {
    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::string const& file : files) {
      if (cmHasLiteralPrefix(file, "$<TARGET_OBJECTS:") &&
          file.back() == '>') {
        std::string objLibName = file.substr(17, file.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << file;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        MessageType messageType = MessageType::AUTHOR_WARNING;
        switch (context.GetBottom().GetPolicy(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains $<TARGET_OBJECTS> generator expression in its "
               "sources list.  This content was not previously part of the "
               "SOURCES property when that property was read at configure "
               "time.  Code reading that property needs to be adapted to "
               "ignore the generator expression using the string(GENEX_STRIP) "
               "command.";
          messenger->IssueMessage(messageType, e.str(), context);
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << file;
        }
      } else if (cmGeneratorExpression::Find(file) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << file;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(file);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return srcs.c_str();
}